

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.h
# Opt level: O0

CustomAttribute
winmd::reader::get_attribute<winmd::reader::InterfaceImpl>
          (InterfaceImpl *row,string_view *type_namespace,string_view *type_name)

{
  uint32_t *values;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  bool bVar1;
  CustomAttribute *pCVar2;
  CustomAttribute CVar3;
  undefined1 local_a0 [8];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  pair;
  value_type *attribute;
  CustomAttribute __end0;
  CustomAttribute __begin0;
  pair<winmd::reader::CustomAttribute,_winmd::reader::CustomAttribute> *__range2;
  string_view *type_name_local;
  string_view *type_namespace_local;
  InterfaceImpl *row_local;
  uint32_t local_10;
  
  InterfaceImpl::CustomAttribute
            ((pair<winmd::reader::CustomAttribute,_winmd::reader::CustomAttribute> *)
             &__begin0.super_row_base<winmd::reader::CustomAttribute>.m_index,row);
  values = &__begin0.super_row_base<winmd::reader::CustomAttribute>.m_index;
  pCVar2 = begin<winmd::reader::CustomAttribute>
                     ((pair<winmd::reader::CustomAttribute,_winmd::reader::CustomAttribute> *)values
                     );
  __end0.super_row_base<winmd::reader::CustomAttribute>._8_8_ =
       (pCVar2->super_row_base<winmd::reader::CustomAttribute>).m_table;
  __begin0.super_row_base<winmd::reader::CustomAttribute>.m_table =
       *(table_base **)&(pCVar2->super_row_base<winmd::reader::CustomAttribute>).m_index;
  pCVar2 = end<winmd::reader::CustomAttribute>
                     ((pair<winmd::reader::CustomAttribute,_winmd::reader::CustomAttribute> *)values
                     );
  attribute = (value_type *)(pCVar2->super_row_base<winmd::reader::CustomAttribute>).m_table;
  __end0.super_row_base<winmd::reader::CustomAttribute>.m_table =
       *(table_base **)&(pCVar2->super_row_base<winmd::reader::CustomAttribute>).m_index;
  do {
    bVar1 = row_base<winmd::reader::CustomAttribute>::operator!=
                      ((row_base<winmd::reader::CustomAttribute> *)
                       &__end0.super_row_base<winmd::reader::CustomAttribute>.m_index,
                       (row_base<winmd::reader::CustomAttribute> *)&attribute);
    if (!bVar1) {
      memset(&row_local,0,0x10);
      CustomAttribute::CustomAttribute((CustomAttribute *)&row_local);
LAB_00179132:
      CVar3.super_row_base<winmd::reader::CustomAttribute>.m_index = local_10;
      CVar3.super_row_base<winmd::reader::CustomAttribute>.m_table = (table_base *)row_local;
      CVar3.super_row_base<winmd::reader::CustomAttribute>._12_4_ = 0;
      return (CustomAttribute)CVar3.super_row_base<winmd::reader::CustomAttribute>;
    }
    pair.second._M_str =
         (char *)row_base<winmd::reader::CustomAttribute>::operator*
                           ((row_base<winmd::reader::CustomAttribute> *)
                            &__end0.super_row_base<winmd::reader::CustomAttribute>.m_index);
    CustomAttribute::TypeNamespaceAndName
              ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                *)local_a0,(CustomAttribute *)pair.second._M_str);
    __y._M_len = type_namespace->_M_len;
    __y._M_str = type_namespace->_M_str;
    __x_00._M_str = (char *)pair.first._M_len;
    __x_00._M_len = (size_t)local_a0;
    bVar1 = std::operator==(__x_00,__y);
    if ((bVar1) &&
       (__y_00._M_len = type_name->_M_len, __y_00._M_str = type_name->_M_str,
       __x._M_str = (char *)pair.second._M_len, __x._M_len = (size_t)pair.first._M_str,
       bVar1 = std::operator==(__x,__y_00), bVar1)) {
      row_local = *(InterfaceImpl **)pair.second._M_str;
      local_10 = (uint32_t)*(undefined8 *)(pair.second._M_str + 8);
      goto LAB_00179132;
    }
    row_base<winmd::reader::CustomAttribute>::operator++
              ((row_base<winmd::reader::CustomAttribute> *)
               &__end0.super_row_base<winmd::reader::CustomAttribute>.m_index);
  } while( true );
}

Assistant:

CustomAttribute get_attribute(T const& row, std::string_view const& type_namespace, std::string_view const& type_name)
    {
        for (auto&& attribute : row.CustomAttribute())
        {
            auto pair = attribute.TypeNamespaceAndName();

            if (pair.first == type_namespace && pair.second == type_name)
            {
                return attribute;
            }
        }

        return {};
    }